

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

bool __thiscall CLOptions::HasPar(CLOptions *this,string *param_name)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          ::count(&this->params_bools,param_name);
  if ((((sVar1 == 0) &&
       (sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                ::count(&this->params_doubles,param_name), sVar2 == 0)) &&
      (sVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
               ::count(&this->params_ints,param_name), sVar3 == 0)) &&
     (sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
              ::count(&this->params_strings,param_name), sVar4 == 0)) {
    return false;
  }
  return true;
}

Assistant:

bool CLOptions::HasPar(const std::string& param_name)
{
    bool par_exists = false;
    // Check if any of the maps has the parameter
    if ((params_bools.count(param_name) > 0) ||
        (params_doubles.count(param_name) > 0) ||
        (params_ints.count(param_name) > 0) ||
        (params_strings.count(param_name) > 0)) {
        
        // The parameter exists
        par_exists = true;
    }

    return par_exists;
}